

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qbuffer.cpp
# Opt level: O2

void QBuffer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  QBufferPrivate::_q_emitSignals((QBufferPrivate *)(_o->d_ptr).d);
  return;
}

Assistant:

void QBuffer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QBuffer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_emitSignals(); break;
        default: ;
        }
    }
    (void)_a;
}